

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall EventLoopThread::threadFunc(EventLoopThread *this)

{
  MutexLockGuard local_90;
  MutexLockGuard lock;
  EventLoop loop;
  EventLoopThread *this_local;
  
  EventLoop::EventLoop((EventLoop *)&lock);
  MutexLockGuard::MutexLockGuard(&local_90,&this->mutex_);
  this->loop_ = (EventLoop *)&lock;
  Condition::notify(&this->cond_);
  MutexLockGuard::~MutexLockGuard(&local_90);
  EventLoop::loop((EventLoop *)&lock);
  this->loop_ = (EventLoop *)0x0;
  EventLoop::~EventLoop((EventLoop *)&lock);
  return;
}

Assistant:

void EventLoopThread::threadFunc() {
  EventLoop loop;

  {
    MutexLockGuard lock(mutex_);
    loop_ = &loop;
    cond_.notify();
  }

  loop.loop();
  // assert(exiting_);
  loop_ = NULL;
}